

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::VMHeap::initialize(VMHeap *this)

{
  size_t sVar1;
  uint8_t *puVar2;
  VMHeap *this_local;
  
  sVar1 = getPageSize();
  this->pageSize = sVar1;
  this->maxCapacity = 0x400000000;
  this->capacity = 0;
  this->size = 0;
  puVar2 = reserveVirtualAddressSpace(this->maxCapacity);
  this->addressSpace = puVar2;
  if (this->addressSpace == (uint8_t *)0x0) {
    fprintf(_stderr,"Failed to reserve the VM heap memory address space.\n");
    abort();
  }
  return;
}

Assistant:

void VMHeap::initialize()
{
    // Get the page size.
    pageSize = getPageSize();

    // Allocate the virtual address space.
    maxCapacity = DefaultMaxVMHeapSize;
    capacity = 0;
    size = 0;
    addressSpace = reserveVirtualAddressSpace(maxCapacity);
    if(!addressSpace)
    {
        fprintf(stderr, "Failed to reserve the VM heap memory address space.\n");
        abort();
    }
}